

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shapeutil_coding.cc
# Opt level: O0

void __thiscall
s2shapeutil::TaggedShapeFactory::TaggedShapeFactory
          (TaggedShapeFactory *this,ShapeDecoder *shape_decoder,Decoder *decoder)

{
  bool bVar1;
  Decoder *decoder_local;
  ShapeDecoder *shape_decoder_local;
  TaggedShapeFactory *this_local;
  
  S2ShapeIndex::ShapeFactory::ShapeFactory(&this->super_ShapeFactory);
  (this->super_ShapeFactory)._vptr_ShapeFactory = (_func_int **)&PTR__TaggedShapeFactory_0062f028;
  std::function<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_(unsigned_int,_Decoder_*)>::
  function(&this->shape_decoder_,shape_decoder);
  s2coding::EncodedStringVector::EncodedStringVector(&this->encoded_shapes_);
  bVar1 = s2coding::EncodedStringVector::Init(&this->encoded_shapes_,decoder);
  if (!bVar1) {
    s2coding::EncodedStringVector::Clear(&this->encoded_shapes_);
  }
  return;
}

Assistant:

TaggedShapeFactory::TaggedShapeFactory(const ShapeDecoder& shape_decoder,
                                       Decoder* decoder)
    : shape_decoder_(shape_decoder) {
  if (!encoded_shapes_.Init(decoder)) encoded_shapes_.Clear();
}